

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::AnyEdgeIntersects
          (S2ShapeIndexRegion<S2ShapeIndex> *this,S2ClippedShape *clipped,S2Cell *target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  int __c;
  R2Rect *this_00;
  undefined1 local_d0 [8];
  R2Point p1;
  R2Point p0;
  Edge edge;
  int i;
  int num_edges;
  S2Shape *shape;
  undefined1 local_68 [4];
  int face;
  undefined1 local_48 [8];
  R2Rect bound;
  S2Cell *target_local;
  S2ClippedShape *clipped_local;
  S2ShapeIndexRegion<S2ShapeIndex> *this_local;
  
  bound.bounds_[1].bounds_.c_[1] = (VType)target;
  if ((AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError == '\0') &&
     (iVar2 = __cxa_guard_acquire(&AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError
                                 ), iVar2 != 0)) {
    AnyEdgeIntersects::kMaxError = 2.3551386880256627e-15;
    __cxa_guard_release(&AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError);
  }
  S2Cell::GetBoundUV((R2Rect *)local_68,(S2Cell *)bound.bounds_[1].bounds_.c_[1]);
  this_00 = (R2Rect *)local_68;
  R2Rect::Expanded((R2Rect *)local_48,this_00,AnyEdgeIntersects::kMaxError);
  iVar2 = S2Cell::face((S2Cell *)bound.bounds_[1].bounds_.c_[1]);
  plVar4 = (long *)index(this,(char *)this_00,__c);
  iVar3 = S2ClippedShape::shape_id(clipped);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,iVar3);
  edge.v1.c_[2]._4_4_ = S2ClippedShape::num_edges(clipped);
  edge.v1.c_[2]._0_4_ = 0;
  while( true ) {
    if (edge.v1.c_[2]._4_4_ <= edge.v1.c_[2]._0_4_) {
      return false;
    }
    iVar3 = S2ClippedShape::edge(clipped,edge.v1.c_[2]._0_4_);
    (**(code **)(*plVar4 + 0x18))(p0.c_ + 1,plVar4,iVar3);
    Vector2<double>::Vector2((Vector2<double> *)(p1.c_ + 1));
    Vector2<double>::Vector2((Vector2<double> *)local_d0);
    bVar1 = S2::ClipToPaddedFace
                      ((S2Point *)(p0.c_ + 1),(S2Point *)(edge.v0.c_ + 2),iVar2,
                       AnyEdgeIntersects::kMaxError,(R2Point *)(p1.c_ + 1),(R2Point *)local_d0);
    if ((bVar1) &&
       (bVar1 = S2::IntersectsRect((R2Point *)(p1.c_ + 1),(R2Point *)local_d0,(R2Rect *)local_48),
       bVar1)) break;
    edge.v1.c_[2]._0_4_ = edge.v1.c_[2]._0_4_ + 1;
  }
  return true;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::AnyEdgeIntersects(
    const S2ClippedShape& clipped, const S2Cell& target) const {
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  const R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  const int face = target.face();
  const S2Shape& shape = *index().shape(clipped.shape_id());
  const int num_edges = clipped.num_edges();
  for (int i = 0; i < num_edges; ++i) {
    const auto edge = shape.edge(clipped.edge(i));
    R2Point p0, p1;
    if (S2::ClipToPaddedFace(edge.v0, edge.v1, face, kMaxError, &p0, &p1) &&
        S2::IntersectsRect(p0, p1, bound)) {
      return true;
    }
  }
  return false;
}